

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# passpredict.cc
# Opt level: O1

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _List_node_base *p_Var2;
  ostream *poVar3;
  long lVar4;
  long *plVar5;
  _List_node_base *p_Var6;
  DateTime end_date;
  DateTime start_date;
  list<PassDetails,_std::allocator<PassDetails>_> pass_list;
  CoordGeodetic geo;
  stringstream ss;
  Tle tle;
  SGP4 sgp4;
  string local_628;
  DateTime local_608;
  DateTime local_600;
  _List_node_base local_5f8;
  undefined8 local_5e8;
  TimeSpan local_5e0;
  string local_5d8;
  string local_5b8;
  string local_598;
  CoordGeodetic local_578;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_560;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_550;
  uint auStack_538 [22];
  ios_base local_4e0 [264];
  Tle local_3d8;
  SGP4 local_300;
  
  local_578.latitude = 0.8989738399880358;
  local_578.longitude = -0.002229440339424615;
  local_578.altitude = 0.05;
  local_598._M_dataplus._M_p = (pointer)&local_598.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_598,"GALILEO-PFM (GSAT0101)  ","");
  local_5b8._M_dataplus._M_p = (pointer)&local_5b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_5b8,
             "1 37846U 11060A   12293.53312491  .00000049  00000-0  00000-0 0  1435","");
  local_5d8._M_dataplus._M_p = (pointer)&local_5d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_5d8,
             "2 37846  54.7963 119.5777 0000994 319.0618  40.9779  1.70474628  6204","");
  libsgp4::Tle::Tle(&local_3d8,&local_598,&local_5b8,&local_5d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
    operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
    operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_598._M_dataplus._M_p != &local_598.field_2) {
    operator_delete(local_598._M_dataplus._M_p,local_598.field_2._M_allocated_capacity + 1);
  }
  libsgp4::OrbitalElements::OrbitalElements(&local_300.elements_,&local_3d8);
  libsgp4::SGP4::Initialise(&local_300);
  libsgp4::Tle::ToString_abi_cxx11_((string *)&local_560,&local_3d8);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_560._M_allocated_capacity,local_560._8_8_)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_560._M_allocated_capacity != &local_550) {
    operator_delete((void *)local_560._M_allocated_capacity,local_550._M_allocated_capacity + 1);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  lVar4 = std::chrono::_V2::system_clock::now();
  local_600.m_encoded = lVar4 / 1000 + 0xdcbffeff2bc000;
  local_608.m_encoded = lVar4 / 1000 + 0xdcc08bd00f6000;
  local_5f8._M_next = &local_5f8;
  local_5e8 = 0;
  local_5f8._M_prev = local_5f8._M_next;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Start time: ",0xc);
  libsgp4::DateTime::ToString_abi_cxx11_((string *)&local_560,&local_600);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_560._M_allocated_capacity,local_560._8_8_)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_560._M_allocated_capacity != &local_550) {
    operator_delete((void *)local_560._M_allocated_capacity,local_550._M_allocated_capacity + 1);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"End time  : ",0xc);
  libsgp4::DateTime::ToString_abi_cxx11_((string *)&local_560,&local_608);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_560._M_allocated_capacity,local_560._8_8_)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_560._M_allocated_capacity != &local_550) {
    operator_delete((void *)local_560._M_allocated_capacity,local_550._M_allocated_capacity + 1);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  plVar5 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  std::ostream::flush();
  GeneratePassList_abi_cxx11_
            ((list<PassDetails,_std::allocator<PassDetails>_> *)&local_560,&local_578,&local_300,
             &local_600,&local_608,0xb4);
  std::__cxx11::list<PassDetails,_std::allocator<PassDetails>_>::_M_move_assign
            ((list<PassDetails,_std::allocator<PassDetails>_> *)&local_5f8,&local_560);
  while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)local_560._M_allocated_capacity != &local_560) {
    paVar1 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               **)local_560._M_allocated_capacity;
    operator_delete((void *)local_560._M_allocated_capacity,0x28);
    local_560._M_allocated_capacity = (size_type)paVar1;
  }
  if (local_5f8._M_next == &local_5f8) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"No passes found",0xf);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
    std::ostream::put(-0x18);
    std::ostream::flush();
    p_Var6 = local_5f8._M_next;
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)local_560._M_local_buf);
    *(uint *)((long)auStack_538 + *(long *)(local_550._M_allocated_capacity - 0x18)) =
         *(uint *)((long)auStack_538 + *(long *)(local_550._M_allocated_capacity - 0x18)) &
         0xffffff4f | 0x80;
    *(undefined8 *)((long)&local_550 + *(long *)(local_550._M_allocated_capacity - 0x18) + 8) = 1;
    *(uint *)((long)auStack_538 + *(long *)(local_550._M_allocated_capacity - 0x18)) =
         *(uint *)((long)auStack_538 + *(long *)(local_550._M_allocated_capacity - 0x18)) &
         0xfffffefb | 4;
    p_Var6 = local_5f8._M_next;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_550._M_local_buf,"AOS: ",5);
      libsgp4::DateTime::ToString_abi_cxx11_(&local_628,(DateTime *)(p_Var6 + 1));
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_550._M_local_buf,local_628._M_dataplus._M_p,
                          local_628._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_628._M_dataplus._M_p != &local_628.field_2) {
        operator_delete(local_628._M_dataplus._M_p,local_628.field_2._M_allocated_capacity + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,", LOS: ",7);
      libsgp4::DateTime::ToString_abi_cxx11_(&local_628,(DateTime *)&p_Var6[1]._M_prev);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,local_628._M_dataplus._M_p,local_628._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_628._M_dataplus._M_p != &local_628.field_2) {
        operator_delete(local_628._M_dataplus._M_p,local_628.field_2._M_allocated_capacity + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,", Max El: ",10);
      *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 4;
      poVar3 = std::ostream::_M_insert<double>
                         (((double)p_Var6[2]._M_next * 180.0) / 3.141592653589793);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,", Duration: ",0xc);
      local_5e0.m_ticks = (long)p_Var6[1]._M_prev - (long)p_Var6[1]._M_next;
      libsgp4::TimeSpan::ToString_abi_cxx11_(&local_628,&local_5e0);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,local_628._M_dataplus._M_p,local_628._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_628._M_dataplus._M_p != &local_628.field_2) {
        operator_delete(local_628._M_dataplus._M_p,local_628.field_2._M_allocated_capacity + 1);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      p_Var6 = p_Var6->_M_next;
    } while (p_Var6 != &local_5f8);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,local_628._M_dataplus._M_p,local_628._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_628._M_dataplus._M_p != &local_628.field_2) {
      operator_delete(local_628._M_dataplus._M_p,local_628.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_560._M_local_buf);
    std::ios_base::~ios_base(local_4e0);
    p_Var6 = local_5f8._M_next;
  }
  while (p_Var6 != &local_5f8) {
    p_Var2 = (((_List_base<PassDetails,_std::allocator<PassDetails>_> *)&p_Var6->_M_next)->_M_impl).
             _M_node.super__List_node_base._M_next;
    operator_delete(p_Var6,0x28);
    p_Var6 = p_Var2;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8.int_designator_._M_dataplus._M_p != &local_3d8.int_designator_.field_2) {
    operator_delete(local_3d8.int_designator_._M_dataplus._M_p,
                    local_3d8.int_designator_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8.line_two_._M_dataplus._M_p != &local_3d8.line_two_.field_2) {
    operator_delete(local_3d8.line_two_._M_dataplus._M_p,
                    local_3d8.line_two_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8.line_one_._M_dataplus._M_p != &local_3d8.line_one_.field_2) {
    operator_delete(local_3d8.line_one_._M_dataplus._M_p,
                    local_3d8.line_one_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8.name_._M_dataplus._M_p != &local_3d8.name_.field_2) {
    operator_delete(local_3d8.name_._M_dataplus._M_p,
                    local_3d8.name_.field_2._M_allocated_capacity + 1);
  }
  return 0;
}

Assistant:

int main()
{
    libsgp4::CoordGeodetic geo(51.507406923983446, -0.12773752212524414, 0.05);
    libsgp4::Tle tle("GALILEO-PFM (GSAT0101)  ",
        "1 37846U 11060A   12293.53312491  .00000049  00000-0  00000-0 0  1435",
        "2 37846  54.7963 119.5777 0000994 319.0618  40.9779  1.70474628  6204");
    libsgp4::SGP4 sgp4(tle);

    std::cout << tle << std::endl;

    /*
     * generate 7 day schedule
     */
    libsgp4::DateTime start_date = libsgp4::DateTime::Now(true);
    libsgp4::DateTime end_date(start_date.AddDays(7.0));

    std::list<struct PassDetails> pass_list;

    std::cout << "Start time: " << start_date << std::endl;
    std::cout << "End time  : " << end_date << std::endl << std::endl;

    /*
     * generate passes
     */
    pass_list = GeneratePassList(geo, sgp4, start_date, end_date, 180);

    if (pass_list.begin() == pass_list.end())
    {
        std::cout << "No passes found" << std::endl;
    }
    else
    {
        std::stringstream ss;

        ss << std::right << std::setprecision(1) << std::fixed;

        std::list<struct PassDetails>::const_iterator itr = pass_list.begin();
        do
        {
            ss  << "AOS: " << itr->aos
                << ", LOS: " << itr->los
                << ", Max El: " << std::setw(4) << libsgp4::Util::RadiansToDegrees(itr->max_elevation)
                << ", Duration: " << (itr->los - itr->aos)
                << std::endl;
        }
        while (++itr != pass_list.end());

        std::cout << ss.str();
    }

    return 0;
}